

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Pos af_latin_compute_stem_width
                 (AF_GlyphHints hints,AF_Dimension dim,FT_Pos width,FT_Pos base_delta,
                 FT_UInt base_flags,FT_UInt stem_flags)

{
  ushort uVar1;
  AF_StyleMetrics_conflict pAVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  uVar4 = hints->other_flags;
  if ((uVar4 & 4) == 0) {
    return width;
  }
  pAVar2 = hints->metrics;
  lVar8 = (ulong)dim * 0x47c8;
  if (*(char *)((long)pAVar2 + lVar8 + 0x1f8) != '\0') {
    return width;
  }
  uVar5 = -width;
  if (0 < width) {
    uVar5 = width;
  }
  if (dim == AF_DIMENSION_VERT) {
    uVar3 = uVar4 & 2;
  }
  else {
    uVar3 = uVar4 & 1;
  }
  if (uVar3 != 0) {
    lVar10 = 0x62;
    uVar9 = uVar5;
    for (lVar11 = 0; (ulong)*(uint *)((long)pAVar2 + lVar8 + 0x60) * 0x18 - lVar11 != 0;
        lVar11 = lVar11 + 0x18) {
      uVar6 = *(ulong *)((long)pAVar2 + lVar11 + lVar8 + 0x70);
      lVar12 = uVar5 - uVar6;
      lVar13 = -lVar12;
      if (0 < lVar12) {
        lVar13 = lVar12;
      }
      if (lVar13 < lVar10) {
        uVar9 = uVar6;
        lVar10 = lVar13;
      }
    }
    uVar6 = uVar9 + 0x20 & 0xffffffffffffffc0;
    bVar14 = (long)uVar5 < (long)(uVar6 | 0x30);
    if ((long)uVar5 < (long)uVar9) {
      bVar14 = (long)(uVar6 - 0x30) < (long)uVar5;
    }
    if (!bVar14) {
      uVar9 = uVar5;
    }
    if (dim == AF_DIMENSION_VERT) {
      if ((long)uVar9 < 0x40) {
LAB_0017d387:
        uVar9 = 0x40;
        goto LAB_0017d411;
      }
      uVar9 = uVar9 + 0x10;
    }
    else {
      if ((uVar4 & 8) == 0) {
        if ((long)uVar9 < 0x30) {
          uVar9 = (long)(uVar9 + 0x40) >> 1;
          goto LAB_0017d411;
        }
        if (uVar9 < 0x80) {
          uVar9 = (ulong)((int)uVar9 + 0x16U & 0xc0);
          uVar7 = uVar9 - uVar5;
          uVar6 = -uVar7;
          if (0 < (long)uVar7) {
            uVar6 = uVar7;
          }
          if ((0xf < uVar6) && (uVar9 = uVar5, uVar5 < 0x30)) {
            uVar9 = uVar5 >> 1 | 0x20;
          }
          goto LAB_0017d411;
        }
      }
      else if ((long)uVar9 < 0x40) goto LAB_0017d387;
      uVar9 = uVar9 + 0x20;
    }
    uVar9 = uVar9 & 0x7fffffffffffffc0;
    goto LAB_0017d411;
  }
  uVar9 = uVar5;
  if (((byte)stem_flags >> 1 & dim == AF_DIMENSION_VERT & uVar5 < 0xc0) != 0) goto LAB_0017d411;
  if ((base_flags & 1) == 0) {
    bVar14 = uVar5 < 0x39;
    uVar9 = 0x38;
  }
  else {
    bVar14 = uVar5 < 0x50;
    uVar9 = 0x40;
  }
  if (!bVar14) {
    uVar9 = uVar5;
  }
  if (*(int *)((long)pAVar2 + lVar8 + 0x60) == 0) goto LAB_0017d411;
  uVar5 = *(ulong *)((long)pAVar2 + lVar8 + 0x70);
  uVar7 = uVar9 - uVar5;
  uVar6 = -uVar7;
  if (0 < (long)uVar7) {
    uVar6 = uVar7;
  }
  if (uVar6 < 0x28) {
    uVar9 = 0x30;
    if (0x30 < (long)uVar5) {
      uVar9 = uVar5;
    }
    goto LAB_0017d411;
  }
  if (uVar9 < 0xc0) {
    uVar4 = (uint)uVar9 & 0x3f;
    if (9 < uVar4) {
      uVar5 = (ulong)((uint)uVar9 & 0xc0);
      if (uVar4 < 0x20) {
        uVar9 = uVar5 | 10;
      }
      else if (uVar4 < 0x36) {
        uVar9 = uVar5 | 0x36;
      }
    }
    goto LAB_0017d411;
  }
  if ((base_delta < 1 || width < 1) && -1 < (base_delta & width)) {
LAB_0017d442:
    lVar8 = 0;
  }
  else {
    uVar1 = (((pAVar2->scaler).face)->size->metrics).x_ppem;
    if (9 < uVar1) {
      if (0x1d < uVar1) goto LAB_0017d442;
      base_delta = (long)((ulong)(0x1e - uVar1) * base_delta) / 0x14;
    }
    lVar8 = -base_delta;
    if (0 < base_delta) {
      lVar8 = base_delta;
    }
  }
  uVar9 = (uVar9 - lVar8) + 0x20 & 0xffffffffffffffc0;
LAB_0017d411:
  uVar5 = -uVar9;
  if (-1 < width) {
    uVar5 = uVar9;
  }
  return uVar5;
}

Assistant:

static FT_Pos
  af_latin_compute_stem_width( AF_GlyphHints  hints,
                               AF_Dimension   dim,
                               FT_Pos         width,
                               FT_Pos         base_delta,
                               FT_UInt        base_flags,
                               FT_UInt        stem_flags )
  {
    AF_LatinMetrics  metrics  = (AF_LatinMetrics)hints->metrics;
    AF_LatinAxis     axis     = &metrics->axis[dim];
    FT_Pos           dist     = width;
    FT_Int           sign     = 0;
    FT_Int           vertical = ( dim == AF_DIMENSION_VERT );


    if ( !AF_LATIN_HINTS_DO_STEM_ADJUST( hints ) ||
         axis->extra_light                       )
      return width;

    if ( dist < 0 )
    {
      dist = -width;
      sign = 1;
    }

    if ( (  vertical && !AF_LATIN_HINTS_DO_VERT_SNAP( hints ) ) ||
         ( !vertical && !AF_LATIN_HINTS_DO_HORZ_SNAP( hints ) ) )
    {
      /* smooth hinting process: very lightly quantize the stem width */

      /* leave the widths of serifs alone */
      if ( ( stem_flags & AF_EDGE_SERIF ) &&
           vertical                       &&
           ( dist < 3 * 64 )              )
        goto Done_Width;

      else if ( base_flags & AF_EDGE_ROUND )
      {
        if ( dist < 80 )
          dist = 64;
      }
      else if ( dist < 56 )
        dist = 56;

      if ( axis->width_count > 0 )
      {
        FT_Pos  delta;


        /* compare to standard width */
        delta = dist - axis->widths[0].cur;

        if ( delta < 0 )
          delta = -delta;

        if ( delta < 40 )
        {
          dist = axis->widths[0].cur;
          if ( dist < 48 )
            dist = 48;

          goto Done_Width;
        }

        if ( dist < 3 * 64 )
        {
          delta  = dist & 63;
          dist  &= -64;

          if ( delta < 10 )
            dist += delta;

          else if ( delta < 32 )
            dist += 10;

          else if ( delta < 54 )
            dist += 54;

          else
            dist += delta;
        }
        else
        {
          /* A stem's end position depends on two values: the start        */
          /* position and the stem length.  The former gets usually        */
          /* rounded to the grid, while the latter gets rounded also if it */
          /* exceeds a certain length (see below in this function).  This  */
          /* `double rounding' can lead to a great difference to the       */
          /* original, unhinted position; this normally doesn't matter for */
          /* large PPEM values, but for small sizes it can easily make     */
          /* outlines collide.  For this reason, we adjust the stem length */
          /* by a small amount depending on the PPEM value in case the     */
          /* former and latter rounding both point into the same           */
          /* direction.                                                    */

          FT_Pos  bdelta = 0;


          if ( ( ( width > 0 ) && ( base_delta > 0 ) ) ||
               ( ( width < 0 ) && ( base_delta < 0 ) ) )
          {
            FT_UInt  ppem = metrics->root.scaler.face->size->metrics.x_ppem;


            if ( ppem < 10 )
              bdelta = base_delta;
            else if ( ppem < 30 )
              bdelta = ( base_delta * (FT_Pos)( 30 - ppem ) ) / 20;

            if ( bdelta < 0 )
              bdelta = -bdelta;
          }

          dist = ( dist - bdelta + 32 ) & ~63;
        }
      }
    }
    else
    {
      /* strong hinting process: snap the stem width to integer pixels */

      FT_Pos  org_dist = dist;


      dist = af_latin_snap_width( axis->widths, axis->width_count, dist );

      if ( vertical )
      {
        /* in the case of vertical hinting, always round */
        /* the stem heights to integer pixels            */

        if ( dist >= 64 )
          dist = ( dist + 16 ) & ~63;
        else
          dist = 64;
      }
      else
      {
        if ( AF_LATIN_HINTS_DO_MONO( hints ) )
        {
          /* monochrome horizontal hinting: snap widths to integer pixels */
          /* with a different threshold                                   */

          if ( dist < 64 )
            dist = 64;
          else
            dist = ( dist + 32 ) & ~63;
        }
        else
        {
          /* for horizontal anti-aliased hinting, we adopt a more subtle */
          /* approach: we strengthen small stems, round stems whose size */
          /* is between 1 and 2 pixels to an integer, otherwise nothing  */

          if ( dist < 48 )
            dist = ( dist + 64 ) >> 1;

          else if ( dist < 128 )
          {
            /* We only round to an integer width if the corresponding */
            /* distortion is less than 1/4 pixel.  Otherwise this     */
            /* makes everything worse since the diagonals, which are  */
            /* not hinted, appear a lot bolder or thinner than the    */
            /* vertical stems.                                        */

            FT_Pos  delta;


            dist = ( dist + 22 ) & ~63;
            delta = dist - org_dist;
            if ( delta < 0 )
              delta = -delta;

            if ( delta >= 16 )
            {
              dist = org_dist;
              if ( dist < 48 )
                dist = ( dist + 64 ) >> 1;
            }
          }
          else
            /* round otherwise to prevent color fringes in LCD mode */
            dist = ( dist + 32 ) & ~63;
        }
      }
    }

  Done_Width:
    if ( sign )
      dist = -dist;

    return dist;
  }